

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O3

ssize_t __thiscall serial::Serial::write(Serial *this,int __fd,void *__buf,size_t __n)

{
  SerialImpl *this_00;
  long lVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  
  this_00 = this->pimpl_;
  SerialImpl::writeLock(this_00);
  lVar1 = *(long *)CONCAT44(in_register_00000034,__fd);
  sVar2 = SerialImpl::write(this->pimpl_,(int)lVar1,
                            (void *)(((long *)CONCAT44(in_register_00000034,__fd))[1] - lVar1),__n);
  SerialImpl::writeUnlock(this_00);
  return sVar2;
}

Assistant:

size_t
Serial::write (const std::vector<uint8_t> &data)
{
  ScopedWriteLock lock(this->pimpl_);
  return this->write_ (&data[0], data.size());
}